

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O3

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  pointer pcVar1;
  iterator __position;
  pointer pbVar2;
  double dVar3;
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  ilzham *lzham_dll_00;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  lzham_uint32 lVar7;
  int iVar8;
  lzham_compress_status_t lVar9;
  uint uVar10;
  ulong uVar11;
  timer_ticks tVar12;
  FILE *pFVar13;
  __off64_t _Var14;
  __off64_t _Var15;
  timer_ticks tVar16;
  undefined1 recursive;
  string_array *files;
  ulong uVar17;
  allocator<char> *paVar18;
  uint uVar19;
  undefined8 uVar20;
  char *pMsg;
  char *pcVar21;
  long lVar22;
  int iVar23;
  ulong uVar24;
  comp_options options;
  lzham_uint32 decomp_adler32;
  string seed_filename;
  size_t cmp_len;
  lzham_uint32 comp_adler32;
  size_t decomp_size;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  undefined1 local_968 [8];
  lzham_compress_level lStack_960;
  uint uStack_95c;
  bool local_958;
  bool bStack_957;
  bool bStack_956;
  bool bStack_955;
  bool bStack_954;
  bool bStack_953;
  bool bStack_952;
  undefined1 uStack_951;
  undefined3 uStack_950;
  undefined1 uStack_94d;
  uint uStack_94c;
  bool local_948;
  bool bStack_947;
  undefined1 uStack_946;
  undefined1 uStack_945;
  uint uStack_944;
  float local_93c;
  timer local_938;
  char *local_918;
  ilzham *local_910;
  string local_908;
  long local_8e8;
  float local_8dc;
  undefined1 local_8d8 [16];
  bool local_8c8;
  bool bStack_8c7;
  bool bStack_8c6;
  bool bStack_8c5;
  bool bStack_8c4;
  bool bStack_8c3;
  undefined2 uStack_8c2;
  undefined4 uStack_8c0;
  uint uStack_8bc;
  bool bStack_8b8;
  bool bStack_8b7;
  undefined1 uStack_8b6;
  undefined1 uStack_8b5;
  uint uStack_8b4;
  undefined8 local_8b0;
  undefined8 uStack_8a8;
  undefined1 local_898 [24];
  undefined1 local_880 [32];
  undefined8 uStack_860;
  size_t local_858;
  undefined5 uStack_850;
  undefined3 uStack_84b;
  undefined5 uStack_848;
  timer_ticks local_840;
  undefined2 *local_838;
  undefined8 local_830;
  undefined2 local_828;
  undefined6 uStack_826;
  allocator<char> local_438 [1032];
  
  local_968._0_4_ = 4;
  local_968._4_4_ = 0x1c;
  lStack_960 = CONCAT31(lStack_960._1_3_,1);
  local_958 = false;
  bStack_957 = false;
  bStack_956 = false;
  bStack_955 = false;
  bStack_954 = false;
  bStack_953 = false;
  bStack_952 = false;
  uStack_950 = 8;
  uStack_94d = 0;
  uStack_94c = 4;
  local_948 = false;
  bStack_947 = false;
  uStack_944 = 0;
  uStack_95c = num_helper_threads;
  if ((cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (cmd_line->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    bStack_8c4 = false;
    bStack_8c3 = false;
    uStack_8c2._0_1_ = false;
    uStack_8c2._1_1_ = 0;
    local_8b0._0_4_ = 0;
    local_8b0._4_4_ = 0;
    uStack_8a8._0_4_ = 0;
    uStack_8a8._4_4_ = 0;
    uStack_8c0 = 0;
    uStack_8bc = 0;
    bStack_8b8 = false;
    bStack_8b7 = false;
    uStack_8b6 = 0;
    uStack_8b5 = 0;
    uStack_8b4 = 0;
    local_8d8._0_4_ = 0x38;
    local_8d8._4_4_ = 0x1a;
    local_8d8._8_4_ = LZHAM_COMP_LEVEL_UBER;
    local_8d8._12_4_ = 0;
    local_8c8 = true;
    bStack_8c7 = false;
    bStack_8c6 = false;
    bStack_8c5 = false;
    local_908._M_dataplus._M_p = (pointer)0x400;
    local_898._0_8_ = (ulong)(uint)local_898._4_4_ << 0x20;
    lVar9 = (*lzham_dll->lzham_compress_memory)
                      ((lzham_compress_params *)local_8d8,(lzham_uint8 *)&local_838,
                       (size_t *)&local_908,
                       (lzham_uint8 *)
                       "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                       ,0x58,(lzham_uint32 *)local_898);
    if (lVar9 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,
             (ulong)local_908._M_dataplus._M_p & 0xffffffff);
      local_880._24_8_ = (void *)0x0;
      uStack_860._0_4_ = 0;
      uStack_860._4_4_ = 0;
      local_880._8_8_ = 0;
      local_880._16_8_ = 0;
      local_880._0_4_ = 0x28;
      local_880._4_4_ = local_8d8._4_4_;
      if ((bool)(undefined1)lStack_960 == true) {
        local_880._8_8_ = 0x200000000;
      }
      local_858 = 0x400;
      local_93c = 0.0;
      timer::timer(&local_938);
      timer::start(&local_938);
      lVar9 = (*lzham_dll->lzham_decompress_memory)
                        ((lzham_decompress_params *)local_880,(lzham_uint8 *)local_438,&local_858,
                         (lzham_uint8 *)&local_838,(size_t)local_908._M_dataplus._M_p,
                         (lzham_uint32 *)&local_93c);
      if (lVar9 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if ((((float)local_898._0_4_ == local_93c) && (local_858 == 0x58)) &&
           (iVar8 = bcmp(local_438,
                         "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                         ,0x58), iVar8 == 0)) {
          dVar3 = timer::get_elapsed_secs(&local_938);
          printf("Decompress time: %3.6f secs\n",SUB84(dVar3,0));
          puts("Compression test succeeded.");
          return 0;
        }
        print_error("Compression test failed!\n");
        return 1;
      }
    }
    print_error("Compression test failed with status %i!\n",(ulong)lVar9);
    return 1;
  }
  local_938.m_start_time = (timer_ticks)&local_938.field_0x10;
  local_938.m_stop_time = 0;
  local_938._16_1_ = 0;
  local_910 = lzham_dll;
  while (tVar16 = local_938.m_stop_time,
        __position._M_current =
             (cmd_line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
        0 < (int)((ulong)((long)(cmd_line->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish -
                         (long)__position._M_current) >> 5)) {
    pcVar21 = ((__position._M_current)->_M_dataplus)._M_p;
    if (*pcVar21 != 0x2d) {
      if ((local_958 == true) && ((char *)local_938.m_stop_time != (char *)0x0)) {
        pcVar21 = "Unbuffered decompression is not compatible with seed files!\n";
      }
      else {
        if ((__position._M_current)->_M_string_length != 1) {
LAB_0010448c:
          pMsg = "Invalid mode: %s\n";
          goto LAB_001044b1;
        }
        iVar8 = tolower((int)*pcVar21);
        lzham_dll_00 = local_910;
        if (iVar8 == 0x61) {
          iVar23 = 2;
        }
        else {
          iVar23 = 0;
          if (iVar8 != 99) {
            if (iVar8 != 100) goto LAB_0010448c;
            iVar23 = 1;
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase(cmd_line,__position);
        puts("Using options:");
        comp_options::print((comp_options *)local_968);
        putchar(10);
        bVar5 = bStack_956;
        pbVar2 = (cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar11 = (long)(cmd_line->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2;
        if (iVar23 == 2) {
          if ((long)uVar11 >> 5 == 1) {
            paVar18 = (allocator<char> *)(pbVar2->_M_dataplus)._M_p;
            local_898._16_2_ = CONCAT11(bStack_957,local_958);
            local_898._12_4_ = uStack_95c;
            local_898._8_4_ = lStack_960;
            local_898._0_8_ = local_968;
            recursive = SUB81(&bStack_955,0);
            uStack_848 = CONCAT41(uStack_944,uStack_945);
            local_858 = CONCAT44(_uStack_951,
                                 CONCAT13(bStack_952,
                                          CONCAT12(bStack_953,CONCAT11(bStack_954,bStack_955))));
            uStack_850 = CONCAT41(uStack_94c,uStack_94d);
            uStack_84b = (undefined3)
                         (CONCAT17(uStack_946,CONCAT16(bStack_947,CONCAT15(local_948,uStack_850)))
                         >> 0x28);
            local_918 = (char *)local_938.m_stop_time;
            if ((char *)local_938.m_stop_time != (char *)0x0) {
              local_918 = (char *)local_938.m_start_time;
            }
            local_908._M_dataplus._M_p = (pointer)0x0;
            local_908._M_string_length = 0;
            local_908.field_2._M_allocated_capacity = 0;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_880,(char *)paVar18,local_438);
            local_828 = 0x2a;
            local_830 = 1;
            local_838 = &local_828;
            bVar6 = find_files((string *)local_880,&local_908,files,(bool)recursive);
            if (local_838 != &local_828) {
              operator_delete(local_838,CONCAT62(uStack_826,local_828) + 1);
            }
            if ((undefined1 *)CONCAT44(local_880._4_4_,local_880._0_4_) != local_880 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_880._4_4_,local_880._0_4_),
                              local_880._16_8_ + 1);
            }
            if (!bVar6) {
              pcVar21 = "Failed finding files under path \"%s\"!\n";
              goto LAB_001045fb;
            }
            tVar16 = timer::get_ticks();
            tVar12 = timer::get_init_ticks();
            local_840 = tVar16;
            sprintf((char *)&local_838,"__comp_temp_%u__.tmp",tVar12 & 0xffffffff);
            sprintf((char *)local_438,"__decomp_temp_%u__.tmp",tVar12 & 0xffffffff);
            if (local_908._M_string_length - (long)local_908._M_dataplus._M_p == 0) {
              uVar19 = 0;
              local_8e8 = 0;
              local_908.field_2._8_8_ = 0;
              goto LAB_001043ed;
            }
            uVar17 = (long)(local_908._M_string_length - (long)local_908._M_dataplus._M_p) >> 5;
            uVar19 = 0;
            local_908.field_2._8_8_ = 0;
            local_8e8 = 0;
            uVar11 = 0;
            uVar24 = 1;
            goto LAB_00103e9c;
          }
          if ((long)uVar11 >> 5 != 0) goto LAB_001044f2;
          pcVar21 = "No directory specified!\n";
        }
        else {
          if (iVar23 == 1) {
            if (uVar11 < 0x21) {
LAB_001044db:
              pcVar21 = "Must specify input and output filenames!\n";
              goto LAB_001044f9;
            }
            if (uVar11 == 0x40) {
              pcVar21 = (char *)local_938.m_stop_time;
              if ((char *)local_938.m_stop_time != (char *)0x0) {
                pcVar21 = (char *)local_938.m_start_time;
              }
              options_00.m_low_memory_finder = bStack_947;
              options_00.m_force_single_threaded_parsing = local_948;
              options_00._34_1_ = uStack_946;
              options_00._35_1_ = uStack_945;
              options_00.m_fast_bytes = uStack_944;
              options_00.m_max_helper_threads = uStack_95c;
              options_00._8_4_ = lStack_960;
              options_00.m_verify_compressed_data = bStack_957;
              options_00.m_unbuffered_decompression = local_958;
              options_00.m_randomize_params = bStack_956;
              options_00.m_extreme_parsing = bStack_955;
              options_00.m_deterministic_parsing = bStack_954;
              options_00.m_tradeoff_decomp_rate_for_comp_ratio = bStack_953;
              options_00.m_test_compressor_reinit = bStack_952;
              options_00._23_1_ = uStack_951;
              options_00.m_table_update_rate._3_1_ = uStack_94d;
              options_00.m_table_update_rate._0_3_ = uStack_950;
              options_00.m_max_best_arrivals = uStack_94c;
              options_00.m_comp_level = local_968._0_4_;
              options_00.m_dict_size_log2 = local_968._4_4_;
              bVar5 = decompress_file(lzham_dll_00,(pbVar2->_M_dataplus)._M_p,
                                      pbVar2[1]._M_dataplus._M_p,options_00,pcVar21,(float *)0x0);
              uVar10 = (uint)!bVar5;
              goto LAB_00104505;
            }
          }
          else {
            if (uVar11 < 0x21) goto LAB_001044db;
            if (uVar11 == 0x40) {
              pcVar21 = (char *)local_938.m_stop_time;
              if ((char *)local_938.m_stop_time != (char *)0x0) {
                pcVar21 = (char *)local_938.m_start_time;
              }
              bVar5 = compress_file(lzham_dll_00,(pbVar2->_M_dataplus)._M_p,
                                    pbVar2[1]._M_dataplus._M_p,(comp_options *)local_968,pcVar21,
                                    (float *)0x0);
              uVar10 = 1;
              if ((!bVar5) || (uVar10 = 0, bStack_957 != true)) goto LAB_00104505;
              tVar16 = timer::get_ticks();
              dVar3 = timer::ticks_to_secs(tVar16);
              sprintf((char *)&local_838,"__decomp_temp_%u__.tmp",(long)(dVar3 * 1000.0));
              pcVar21 = (char *)local_938.m_stop_time;
              if ((char *)local_938.m_stop_time != (char *)0x0) {
                pcVar21 = (char *)local_938.m_start_time;
              }
              options_02.m_low_memory_finder = bStack_947;
              options_02.m_force_single_threaded_parsing = local_948;
              options_02._34_1_ = uStack_946;
              options_02._35_1_ = uStack_945;
              options_02.m_fast_bytes = uStack_944;
              options_02.m_max_helper_threads = uStack_95c;
              options_02._8_4_ = lStack_960;
              options_02.m_verify_compressed_data = bStack_957;
              options_02.m_unbuffered_decompression = local_958;
              options_02.m_randomize_params = bStack_956;
              options_02.m_extreme_parsing = bStack_955;
              options_02.m_deterministic_parsing = bStack_954;
              options_02.m_tradeoff_decomp_rate_for_comp_ratio = bStack_953;
              options_02.m_test_compressor_reinit = bStack_952;
              options_02._23_1_ = uStack_951;
              options_02.m_table_update_rate._3_1_ = uStack_94d;
              options_02.m_table_update_rate._0_3_ = uStack_950;
              options_02.m_max_best_arrivals = uStack_94c;
              options_02.m_comp_level = local_968._0_4_;
              options_02.m_dict_size_log2 = local_968._4_4_;
              bVar5 = decompress_file(lzham_dll_00,pbVar2[1]._M_dataplus._M_p,(char *)&local_838,
                                      options_02,pcVar21,(float *)0x0);
              if (bVar5) {
                printf("Comparing file \"%s\" to \"%s\"\n",&local_838,(pbVar2->_M_dataplus)._M_p);
                bVar5 = compare_files((char *)&local_838,(pbVar2->_M_dataplus)._M_p);
                if (!bVar5) {
                  print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n"
                              ,(pbVar2->_M_dataplus)._M_p,pbVar2[1]._M_dataplus._M_p);
                  goto LAB_00104500;
                }
                puts("Decompressed file compared OK to original file.");
                remove((char *)&local_838);
                uVar10 = 0;
                goto LAB_00104505;
              }
              pcVar21 = (char *)local_938.m_stop_time;
              if ((char *)local_938.m_stop_time != (char *)0x0) {
                pcVar21 = (char *)local_938.m_start_time;
              }
              print_error("Failed decompressing file \"%s\" to \"%s\"\n",pbVar2[1]._M_dataplus._M_p,
                          &local_838,pcVar21);
              goto LAB_00104500;
            }
          }
LAB_001044f2:
          pcVar21 = "Too many filenames!\n";
        }
      }
LAB_001044f9:
      print_error(pcVar21);
      goto LAB_00104500;
    }
    if ((__position._M_current)->_M_string_length < 2) {
switchD_001038c8_caseD_67:
      pMsg = "Invalid option: %s\n";
LAB_001044b1:
      print_error(pMsg,pcVar21);
      goto LAB_00104500;
    }
    uVar19 = uStack_95c;
    switch(pcVar21[1]) {
    case 'a':
      strlen(pcVar21 + 2);
      std::__cxx11::string::_M_replace((ulong)&local_938,0,(char *)tVar16,(ulong)(pcVar21 + 2));
      if ((char *)local_938.m_stop_time == (char *)0x0) {
        pcVar21 = "Must specify seed filename with -a option!\n";
        goto LAB_001044f9;
      }
      printf("Seed filename: %s\n",local_938.m_start_time);
      uVar19 = uStack_95c;
      break;
    case 'b':
      local_948 = true;
      break;
    case 'c':
      lStack_960 = lStack_960 & 0xffffff00;
      break;
    case 'd':
      lVar7 = atoi(pcVar21 + 2);
      if (lVar7 - 0xf < 0xf) {
        local_968._4_4_ = lVar7;
        uVar19 = uStack_95c;
        break;
      }
      pMsg = "Invalid dictionary size: %s\n";
      goto LAB_001044b1;
    case 'e':
      bStack_954 = true;
      break;
    case 'f':
      uStack_944 = atoi(pcVar21 + 2);
      uVar19 = uStack_95c;
      break;
    case 'g':
    case 'j':
    case 'k':
    case 'l':
    case 'n':
    case 'p':
    case 'q':
    case 'w':
      goto switchD_001038c8_caseD_67;
    case 'h':
      uVar19 = atoi(pcVar21 + 2);
      if (0x14 < uVar19) {
        pMsg = "Invalid table update rate: %s\n";
        goto LAB_001044b1;
      }
      uStack_950 = (undefined3)uVar19;
      uStack_94d = (undefined1)(uVar19 >> 0x18);
      uVar19 = uStack_95c;
      break;
    case 'i':
      bStack_952 = true;
      bStack_954 = true;
      break;
    case 'm':
      uVar19 = atoi(pcVar21 + 2);
      if (4 < uVar19) {
        pMsg = "Invalid compression level: %s\n";
        goto LAB_001044b1;
      }
      local_968._0_4_ = uVar19;
      uVar19 = uStack_95c;
      break;
    case 'o':
      bStack_953 = true;
      break;
    case 'r':
      bStack_956 = true;
      break;
    case 's':
      uVar19 = atoi(pcVar21 + 2);
      srand(uVar19);
      printf("Using random seed: %i\n",(ulong)uVar19);
      uVar19 = uStack_95c;
      break;
    case 't':
      uVar19 = atoi(pcVar21 + 2);
      if (0x40 < uVar19) {
        pMsg = "Invalid number of helper threads: %s\n";
        goto LAB_001044b1;
      }
      break;
    case 'u':
      local_958 = true;
      break;
    case 'v':
      bStack_957 = true;
      break;
    case 'x':
      bStack_955 = true;
      pcVar1 = ((__position._M_current)->_M_dataplus)._M_p;
      if (pcVar1[2] != '\0') {
        uStack_94c = atoi(pcVar1 + 2);
        uVar19 = uStack_95c;
      }
      break;
    default:
      if (pcVar21[1] != 'F') goto switchD_001038c8_caseD_67;
      bStack_947 = true;
    }
    uStack_95c = uVar19;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(cmd_line,(cmd_line->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start);
  }
  print_error("No mode specified!\n");
  print_usage();
LAB_00104500:
  uVar10 = 1;
LAB_00104505:
  if ((undefined1 *)local_938.m_start_time != &local_938.field_0x10) {
    operator_delete((void *)local_938.m_start_time,CONCAT71(local_938._17_7_,local_938._16_1_) + 1);
  }
  return uVar10;
LAB_00103e9c:
  _Var4._M_p = local_908._M_dataplus._M_p;
  lVar22 = uVar11 * 0x20;
  pcVar1 = local_908._M_dataplus._M_p + lVar22;
  printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",uVar24,uVar17,
         *(undefined8 *)(local_908._M_dataplus._M_p + lVar22),&local_838);
  pFVar13 = fopen64(*(char **)(_Var4._M_p + lVar22),"rb");
  if (pFVar13 == (FILE *)0x0) {
    printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar1);
    goto LAB_0010428c;
  }
  fseek(pFVar13,0,2);
  _Var14 = ftello64(pFVar13);
  if (_Var14 != 0) {
    fseek(pFVar13,0,0);
    iVar8 = fgetc(pFVar13);
    if (iVar8 == -1) {
      printf("Skipping unreadable file \"%s\"\n",*(undefined8 *)pcVar1);
      fclose(pFVar13);
      goto LAB_0010428c;
    }
  }
  fclose(pFVar13);
  bVar6 = ensure_file_is_writable((char *)&local_838);
  if (!bVar6) {
    pcVar21 = "Unable to create file \"%s\"!\n";
    paVar18 = (allocator<char> *)&local_838;
    goto LAB_001045fb;
  }
  local_8c8 = SUB21(local_898._16_2_,0);
  bStack_8c7 = SUB21(local_898._16_2_,1);
  local_8d8._0_8_ = local_898._0_8_;
  local_8d8._8_8_ = local_898._8_8_;
  bStack_8c6 = bVar5;
  uStack_8b5 = (undefined1)uStack_848;
  uStack_8b4 = (uint)((uint5)uStack_848 >> 8);
  bStack_8c5 = SUB81(local_858,0);
  bStack_8c4 = SUB81(local_858 >> 8,0);
  bStack_8c3 = SUB81(local_858 >> 0x10,0);
  uStack_8c2 = (undefined2)(local_858 >> 0x18);
  uStack_8c0._0_3_ = (undefined3)(local_858 >> 0x28);
  uStack_8c0._3_1_ = (undefined1)uStack_850;
  uStack_8bc = (uint)((uint5)uStack_850 >> 8);
  bStack_8b8 = SUB31(uStack_84b,0);
  bStack_8b7 = SUB31((uint3)uStack_84b >> 8,0);
  uStack_8b6 = (undefined1)((uint3)uStack_84b >> 0x10);
  if ((bVar5 & 1U) != 0) {
    bVar6 = local_918 == (char *)0x0;
    uVar10 = rand();
    local_8d8._0_4_ = uVar10 % 5;
    iVar8 = rand();
    local_8d8._4_4_ = iVar8 % 0xf + 0xf;
    iVar8 = rand();
    local_8d8._12_4_ = iVar8 % 0x41;
    iVar8 = rand();
    local_8c8 = (bool)((byte)iVar8 & bVar6);
    iVar8 = rand();
    bStack_8c4 = (bool)((byte)iVar8 & 1);
    iVar8 = rand();
    bStack_8c3 = (bool)((byte)iVar8 & 1);
    iVar8 = rand();
    uStack_8c0 = iVar8 % 0x13 + 2;
    iVar8 = rand();
    uStack_8bc = iVar8 % 7 + 2;
    iVar8 = rand();
    bStack_8b8 = (bool)((byte)iVar8 & 1);
    iVar8 = rand();
    bStack_8b7 = (bool)((byte)iVar8 & 1);
    iVar8 = rand();
    uStack_8b4 = iVar8 % 0xfb + 8;
    comp_options::print((comp_options *)local_8d8);
  }
  local_93c = 0.0;
  local_8dc = 0.0;
  bVar6 = compress_file(local_910,*(char **)pcVar1,(char *)&local_838,(comp_options *)local_8d8,
                        local_918,&local_93c);
  if (!bVar6) {
    uVar20 = *(undefined8 *)pcVar1;
    pcVar21 = "Failed compressing file \"%s\" to \"%s\"\n";
LAB_00104626:
    paVar18 = (allocator<char> *)&local_838;
LAB_0010462e:
    print_error(pcVar21,uVar20,paVar18);
    goto LAB_00104635;
  }
  if (bStack_8c7 == true) {
    printf("Decompressing file \"%s\" to \"%s\"\n",&local_838,local_438);
    bVar6 = ensure_file_is_writable((char *)local_438);
    if (!bVar6) {
      pcVar21 = "Unable to create file \"%s\"!\n";
      paVar18 = local_438;
LAB_001045fb:
      print_error(pcVar21,paVar18);
LAB_00104635:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_908);
      goto LAB_00104500;
    }
    options_01.m_low_memory_finder = bStack_8b7;
    options_01.m_force_single_threaded_parsing = bStack_8b8;
    options_01._34_1_ = uStack_8b6;
    options_01._35_1_ = uStack_8b5;
    options_01.m_fast_bytes = uStack_8b4;
    options_01.m_verify_compressed_data = bStack_8c7;
    options_01.m_unbuffered_decompression = local_8c8;
    options_01.m_randomize_params = bStack_8c6;
    options_01.m_extreme_parsing = bStack_8c5;
    options_01.m_deterministic_parsing = bStack_8c4;
    options_01.m_tradeoff_decomp_rate_for_comp_ratio = bStack_8c3;
    options_01.m_test_compressor_reinit = uStack_8c2._0_1_;
    options_01._23_1_ = uStack_8c2._1_1_;
    options_01.m_max_best_arrivals = uStack_8bc;
    options_01.m_table_update_rate = uStack_8c0;
    options_01.m_compute_adler32_during_decomp = (bool)local_8d8[8];
    options_01._9_3_ = local_8d8._9_3_;
    options_01.m_max_helper_threads = local_8d8._12_4_;
    options_01.m_comp_level = local_8d8._0_4_;
    options_01.m_dict_size_log2 = local_8d8._4_4_;
    bVar6 = decompress_file(local_910,(char *)&local_838,(char *)local_438,options_01,local_918,
                            &local_8dc);
    uVar20 = *(undefined8 *)pcVar1;
    if (!bVar6) {
      pcVar21 = "Failed decompressing file \"%s\" to \"%s\"\n";
      paVar18 = local_438;
      goto LAB_0010462e;
    }
    printf("Comparing file \"%s\" to \"%s\"\n",local_438);
    bVar6 = compare_files((char *)local_438,*(char **)pcVar1);
    if (!bVar6) {
      uVar20 = *(undefined8 *)pcVar1;
      pcVar21 = "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
      goto LAB_00104626;
    }
    puts("Decompressed file compared OK to original file.");
  }
  pFVar13 = fopen64((char *)&local_838,"rb");
  if (pFVar13 == (FILE *)0x0) {
    _Var15 = 0;
  }
  else {
    fseek(pFVar13,0,2);
    _Var15 = ftello64(pFVar13);
    fclose(pFVar13);
  }
  local_8e8 = local_8e8 + _Var15;
  local_908.field_2._8_8_ = local_908.field_2._8_8_ + _Var14;
  uVar19 = uVar19 + 1;
  putchar(10);
LAB_0010428c:
  uVar17 = (long)(local_908._M_string_length - (long)local_908._M_dataplus._M_p) >> 5;
  bVar6 = uVar17 <= uVar24;
  uVar11 = uVar24;
  uVar24 = (ulong)((int)uVar24 + 1);
  if (bVar6) goto LAB_001043ed;
  goto LAB_00103e9c;
LAB_001043ed:
  tVar16 = timer::get_ticks();
  dVar3 = timer::ticks_to_secs(tVar16 - local_840);
  printf("Test successful: %f secs\n",SUB84(dVar3,0));
  uVar10 = 0;
  printf("Total files processed: %u\n",(ulong)uVar19);
  printf("Total source size: %llu\n",local_908.field_2._8_8_);
  printf("Total compressed size: %llu\n",local_8e8);
  remove((char *)&local_838);
  remove((char *)local_438);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_908);
  goto LAB_00104505;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;
   std::string seed_filename;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (str[1])
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
				case 'h':
				{
					int update_rate = atoi(str.c_str() + 2);
					if ((update_rate < 0) || (update_rate > LZHAM_FASTEST_TABLE_UPDATE_RATE))
					{
						print_error("Invalid table update rate: %s\n", str.c_str());
						return EXIT_FAILURE;
					}
					options.m_table_update_rate = update_rate;
					break;
				}
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;

               if (str[2])
               {
                  options.m_max_best_arrivals = atoi(str.c_str() + 2);
               }

               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 'o':
            {
               options.m_tradeoff_decomp_rate_for_comp_ratio = true;
               break;
            }
            case 'i':
            {
               options.m_test_compressor_reinit = true;
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            case 'a':
            {
               seed_filename = str.c_str() + 2;
               if (seed_filename.empty())
               {
                  print_error("Must specify seed filename with -a option!\n");
                  return EXIT_FAILURE;
               }
               printf("Seed filename: %s\n", seed_filename.c_str());
               break;
            }
            case 'b':
            {
               options.m_force_single_threaded_parsing = true;
               break;
            }
            case 'F':
            {
               options.m_low_memory_finder = true;
               break;
            }
            case 'f':
            {
               options.m_fast_bytes = atoi(str.c_str() + 2);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if ((options.m_unbuffered_decompression) && (!seed_filename.empty()))
      {
         print_error("Unbuffered decompression is not compatible with seed files!\n");
         return EXIT_FAILURE;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_file(lzham_dll, src_file.c_str(), cmp_file.c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options, seed_filename.length() ? seed_filename.c_str() : NULL))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file, seed_filename.length() ? seed_filename.c_str() : NULL);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         for (uint i = 0; i < 1; i++)
         {
            if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
               exit_status = EXIT_SUCCESS;
            else
               break;
         }
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

#if 0
			file_stats_vec stats;

         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL, &stats, 1, 1024*1024*512))
				exit_status = EXIT_SUCCESS;

			FILE *pFile = fopen("stats.csv", "w");
			if (pFile)
			{
				const float cpu_slowdown = 12.0f;
				float low_bps = 10000.0f;
				float scale_bps = 3125000.0f / 5.0f;
				//const float low_bps = 10000.0f / 10.0f;
				//const float scale_bps = 3125000.0f / 10.0f;

				for (uint i = 0; i < stats.size(); i++)
				{
					fprintf(pFile, "%s, %" PRIi64 ", , %" PRIi64 ", %f, %f, %f, , %" PRIi64 ", %f, %f, %f",
						stats[i].m_filename.c_str(),
						stats[i].m_size,
						stats[i].m_lzma_size, ((1.0f - (static_cast<float>(stats[i].m_lzma_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzma_comp_time, stats[i].m_lzma_decomp_time,
						stats[i].m_lzham_size, ((1.0f - (static_cast<float>(stats[i].m_lzham_size) / stats[i].m_size)) * 100.0f), stats[i].m_lzham_comp_time, stats[i].m_lzham_decomp_time);

#if 0
					fprintf(pFile, ",");
					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzma_size / bps;
						float decomp_time = stats[i].m_lzma_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lzham_size / bps;
						float decomp_time = stats[i].m_lzham_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", stats[i].m_size / total_time / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_miniz_size / bps;
						float decomp_time = stats[i].m_miniz_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_size / bps;
						float decomp_time = 0.0f;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}

					fprintf(pFile, ",");

					for (uint j = 0; j < 64; j++)
					{
						float bps = (low_bps + (j * scale_bps)) / 8.0f;
						float download_time = stats[i].m_lz4_size / bps;
						float decomp_time = stats[i].m_lz4_decomp_time * cpu_slowdown;

						float total_time = bf::math::maximum<float>(download_time, decomp_time);
						//float total_time = download_time + decomp_time;
						fprintf(pFile, ", %3.2f", (stats[i].m_size / total_time) / (1024.0f*1024.0f));
					}
#endif

					fprintf(pFile, "\n");
				}

#if 0
				for (uint j = 0; j < 64; j++)
				{
					fprintf(pFile, "%3.2f, ",  (low_bps + (j * scale_bps)) / 8.0f / (1024.0f * 1024.0f));
				}
#endif

				fclose(pFile);
			}
#else
			if (test_recursive(lzham_dll, cmd_line[0].c_str(), options, seed_filename.length() ? seed_filename.c_str() : NULL))
				exit_status = EXIT_SUCCESS;
#endif

         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}